

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_addmul_v_uint64_129(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  long in_RDX;
  long *in_RSI;
  block_t *in_RDI;
  word mask_1;
  uint i;
  word idx_1;
  uint w;
  word mask;
  word idx;
  block_t *Ablock;
  word *vptr;
  block_t *cblock;
  int local_54;
  ulong local_50;
  int local_44;
  block_t *local_30;
  ulong *local_28;
  
  mzd_xor_mask_uint64_block(in_RDI,(block_t *)(in_RDX + 0x7e0),*in_RSI >> 0x3f,3);
  local_30 = (block_t *)(in_RDX + 0x800);
  local_28 = (ulong *)(in_RSI + 1);
  for (local_44 = 2; local_44 != 0; local_44 = local_44 + -1) {
    local_50 = *local_28;
    for (local_54 = 0x40; local_54 != 0; local_54 = local_54 + -1) {
      mzd_xor_mask_uint64_block(in_RDI,local_30,-(local_50 & 1),3);
      local_50 = local_50 >> 1;
      local_30 = local_30 + 1;
    }
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void mzd_addmul_v_uint64_129(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  Ablock += 63;
  {
    word idx        = (*vptr) >> 63;
    const word mask = -(idx & 1);
    mzd_xor_mask_uint64_block(cblock, Ablock, mask, 3);
    Ablock++;
    vptr++;
  }

  for (unsigned int w = 2; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; --i, idx >>= 1, ++Ablock) {
      const word mask = -(idx & 1);
      mzd_xor_mask_uint64_block(cblock, Ablock, mask, 3);
    }
  }
}